

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory_unix.cpp
# Opt level: O0

bool findFiles(string *path,string *fileMask,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *fileList,bool savePaths)

{
  dirent64 *pdVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  char *pcVar2;
  char *__name;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  allocator<char> local_61;
  undefined1 local_60 [8];
  string fileName;
  dirent64 **ppdStack_38;
  int n;
  dirent **namelist;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_28;
  bool savePaths_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *fileList_local;
  string *fileMask_local;
  string *path_local;
  
  namelist._7_1_ = savePaths;
  pvStack_28 = fileList;
  fileList_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)fileMask;
  fileMask_local = path;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  fileName.field_2._12_4_ =
       scandir64(pcVar2,&stack0xffffffffffffffc8,(__selector *)0x0,(__cmp *)0x0);
  if ((int)fileName.field_2._12_4_ < 0) {
    path_local._7_1_ = false;
  }
  else {
    while (iVar3 = fileName.field_2._12_4_ + -1, fileName.field_2._12_4_ != 0) {
      fileName.field_2._12_4_ = iVar3;
      if (ppdStack_38[iVar3]->d_type == '\b') {
        pdVar1 = ppdStack_38[iVar3];
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_60,pdVar1->d_name,&local_61);
        std::allocator<char>::~allocator(&local_61);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        __name = (char *)std::__cxx11::string::c_str();
        iVar3 = fnmatch(pcVar2,__name,0);
        this = pvStack_28;
        if (iVar3 == 0) {
          if ((namelist._7_1_ & 1) == 0) {
            std::__cxx11::string::string((string *)&local_98,(string *)local_60);
          }
          else {
            std::operator+(&local_98,fileMask_local,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_60);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(this,&local_98);
          std::__cxx11::string::~string((string *)&local_98);
        }
        std::__cxx11::string::~string((string *)local_60);
      }
      free(ppdStack_38[(int)fileName.field_2._12_4_]);
    }
    fileName.field_2._12_4_ = iVar3;
    free(ppdStack_38);
    path_local._7_1_ = true;
  }
  return path_local._7_1_;
}

Assistant:

bool findFiles(const string& path, const string& fileMask, vector<string>* fileList, bool savePaths)
{
    dirent** namelist;

    int n = scandir(path.c_str(), &namelist, 0, 0);  // alphasort);

    if (n < 0)
    {
        return false;
    }
    else
    {
        while (n--)
        {
            if (namelist[n]->d_type == DT_REG)
            {
                string fileName(namelist[n]->d_name);

                if (0 == fnmatch(fileMask.c_str(), fileName.c_str(), 0))
                    fileList->push_back(savePaths ? path + fileName : fileName);
            }
            free(namelist[n]);
        }
        free(namelist);
    }

    return true;
}